

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_transcode.cpp
# Opt level: O3

int __thiscall
ktx::CommandTranscode::OptionsTranscode::init(OptionsTranscode *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int iVar3;
  OptionAdder *pOVar4;
  undefined1 local_109;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  shared_ptr<const_cxxopts::Value> local_c8;
  OptionAdder local_b0;
  string local_88;
  string local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_108 = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  uVar2 = local_f8._M_allocated_capacity._0_4_;
  local_b0.m_group._M_string_length = local_100;
  if (local_108 == &local_f8) {
    local_e8.field_2._8_4_ = local_f8._8_4_;
    local_e8.field_2._12_4_ = local_f8._12_4_;
    local_108 = &local_e8.field_2;
  }
  local_e8.field_2._M_allocated_capacity._4_4_ = local_f8._M_allocated_capacity._4_4_;
  local_e8.field_2._M_allocated_capacity._0_4_ = local_f8._M_allocated_capacity._0_4_;
  local_100 = 0;
  local_f8._M_allocated_capacity._0_4_ = local_f8._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &local_b0.m_group.field_2;
  if (local_108 == &local_e8.field_2) {
    local_b0.m_group.field_2._M_allocated_capacity =
         CONCAT44(local_f8._M_allocated_capacity._4_4_,uVar2);
    local_b0.m_group.field_2._8_4_ = local_e8.field_2._8_4_;
    local_b0.m_group.field_2._12_4_ = local_e8.field_2._12_4_;
    local_b0.m_group._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.m_group.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
    local_b0.m_group._M_dataplus._M_p = (pointer)local_108;
  }
  local_108 = &local_f8;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_b0.m_options = (Options *)ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"target","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "Target transcode format. Block compressed transcode targets can only be saved in raw format. Case-insensitive.\nPossible options are: etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc | r8 | rg8 | rgb8 | rgba8.\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2."
             ,"");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_48,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_109);
  local_c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_48;
  local_c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       uStack_44;
  local_c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_40;
  local_c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_3c;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"<target>","");
  pOVar4 = cxxopts::OptionAdder::operator()(&local_b0,&local_e8,&local_68,&local_c8,&local_88);
  iVar3 = (int)pOVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_c8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_c8.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
    iVar3 = extraout_EAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_group._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.m_group._M_dataplus._M_p,
                    local_b0.m_group.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX_03;
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,
                    CONCAT44(local_f8._M_allocated_capacity._4_4_,
                             local_f8._M_allocated_capacity._0_4_) + 1);
    iVar3 = extraout_EAX_04;
  }
  return iVar3;
}

Assistant:

void CommandTranscode::OptionsTranscode::init(cxxopts::Options& opts) {
    opts.add_options()
        ("target", "Target transcode format."
                   " Block compressed transcode targets can only be saved in raw format."
                   " Case-insensitive."
                   "\nPossible options are:"
                   " etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc |"
                   " r8 | rg8 | rgb8 | rgba8."
                   "\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2.",
                   cxxopts::value<std::string>(), "<target>");
}